

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O1

int Min_SopCheck(Min_Man_t *p)

{
  char *pEntry;
  long lVar1;
  Min_Cube_t *pMVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  pEntry = Extra_MmFixedEntryFetch(p->pMemMan);
  pEntry[0] = '\0';
  pEntry[1] = '\0';
  pEntry[2] = '\0';
  pEntry[3] = '\0';
  pEntry[4] = '\0';
  pEntry[5] = '\0';
  pEntry[6] = '\0';
  pEntry[7] = '\0';
  uVar4 = p->nVars & 0x3ff;
  *(uint *)(pEntry + 8) = *(uint *)(pEntry + 8) & 0xfffffc00 | uVar4;
  iVar5 = (p->nWords & 0xfffU) * 0x400;
  *(uint *)(pEntry + 8) = uVar4 + iVar5;
  memset(pEntry + 0xc,0xff,(long)p->nWords << 2);
  *(uint *)(pEntry + 0xc) = *(uint *)(pEntry + 0xc) ^ 0x295a;
  *(uint *)(pEntry + 8) = uVar4 + iVar5 + 0x1c00000;
  if (-1 < p->nVars) {
    lVar1 = 0;
    iVar5 = 1;
    do {
      pMVar2 = p->ppStore[lVar1];
      if (pMVar2 != (Min_Cube_t *)0x0) {
        do {
          if (pMVar2 != p->pBubble) {
            uVar4 = *(uint *)&pMVar2->field_0x8 >> 10 & 0xfff;
            if (uVar4 == 0) goto LAB_003d3871;
            uVar3 = 0;
            while ((*(uint *)(pEntry + 0xc + uVar3 * 4) & ~pMVar2->uData[uVar3]) == 0) {
              uVar3 = uVar3 + 1;
              if (uVar4 == uVar3) goto LAB_003d3871;
            }
          }
          pMVar2 = pMVar2->pNext;
        } while (pMVar2 != (Min_Cube_t *)0x0);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != (ulong)(uint)p->nVars + 1);
  }
  iVar5 = 0;
LAB_003d3871:
  Extra_MmFixedEntryRecycle(p->pMemMan,pEntry);
  return iVar5;
}

Assistant:

int Min_SopCheck( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pThis;
    int i;

    pCube = Min_CubeAlloc( p );
    Min_CubeXorBit( pCube, 2*0+1 );
    Min_CubeXorBit( pCube, 2*1+1 );
    Min_CubeXorBit( pCube, 2*2+0 );
    Min_CubeXorBit( pCube, 2*3+0 );
    Min_CubeXorBit( pCube, 2*4+0 );
    Min_CubeXorBit( pCube, 2*5+1 );
    Min_CubeXorBit( pCube, 2*6+1 );
    pCube->nLits = 7;

//    Min_CubeWrite( stdout, pCube );

    // check that the cubes contain it
    for ( i = 0; i <= p->nVars; i++ )
        Min_CoverForEachCube( p->ppStore[i], pThis )
            if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
            {
                Min_CubeRecycle( p, pCube );
                return 1;
            }
    Min_CubeRecycle( p, pCube );
    return 0;
}